

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall
LLVMBC::BranchInst::BranchInst
          (BranchInst *this,BasicBlock *true_block,BasicBlock *false_block,Value *cond_)

{
  Instruction::Instruction(&this->super_Instruction,(Type *)0x0,Branch);
  this->cond = cond_;
  (this->super_Instruction).is_terminator = true;
  this->num_blocks = 2;
  this->bbs[0] = true_block;
  this->bbs[1] = false_block;
  return;
}

Assistant:

BranchInst::BranchInst(BasicBlock *true_block, BasicBlock *false_block, Value *cond_)
    : Instruction(nullptr, ValueKind::Branch)
    , cond(cond_)
{
	set_terminator();
	num_blocks = 2;
	bbs[0] = true_block;
	bbs[1] = false_block;
}